

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmem.c
# Opt level: O0

void * luaM_realloc_(lua_State *L,void *block,size_t osize,size_t nsize)

{
  global_State *pgVar1;
  size_t local_48;
  size_t realosize;
  global_State *g;
  void *newblock;
  size_t nsize_local;
  size_t osize_local;
  void *block_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  local_48 = osize;
  if (block == (void *)0x0) {
    local_48 = 0;
  }
  g = (global_State *)(*pgVar1->frealloc)(pgVar1->ud,block,osize,nsize);
  if ((g == (global_State *)0x0) && (nsize != 0)) {
    if (pgVar1->version != (lua_Number *)0x0) {
      luaC_fullgc(L,1);
      g = (global_State *)(*pgVar1->frealloc)(pgVar1->ud,block,osize,nsize);
    }
    if (g == (global_State *)0x0) {
      luaD_throw(L,4);
    }
  }
  pgVar1->GCdebt = (pgVar1->GCdebt + nsize) - local_48;
  return g;
}

Assistant:

void *luaM_realloc_(lua_State *L, void *block, size_t osize, size_t nsize) {
    void *newblock;
    global_State *g = G(L);
    size_t realosize = (block) ? osize : 0;
    lua_assert((realosize == 0) == (block == NULL));
#if defined(HARDMEMTESTS)
    if (nsize > realosize && g->gcrunning)
      luaC_fullgc(L, 1);  /* force a GC whenever possible */
#endif
    newblock = (*g->frealloc)(g->ud, block, osize, nsize);
    if (newblock == NULL && nsize > 0) {
        lua_assert(nsize > realosize);  /* cannot fail when shrinking a block */
        if (g->version) {  /* is state fully built? */
            luaC_fullgc(L, 1);  /* try to free some memory... */
            newblock = (*g->frealloc)(g->ud, block, osize, nsize);  /* try again */
        }
        if (newblock == NULL)
            luaD_throw(L, LUA_ERRMEM);
    }
    lua_assert((nsize == 0) == (newblock == NULL));
    g->GCdebt = (g->GCdebt + nsize) - realosize;
    return newblock;
}